

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_long> *op;
  example *peVar3;
  int i;
  float fVar4;
  long lVar5;
  allocator local_5dc;
  allocator local_5db;
  allocator local_5da;
  allocator local_5d9;
  allocator local_5d8;
  allocator local_5d7;
  allocator local_5d6;
  allocator local_5d5;
  allocator local_5d4;
  allocator local_5d3;
  allocator local_5d2;
  allocator local_5d1;
  string local_5d0 [32];
  string local_5b0;
  string local_590 [32];
  string local_570;
  string local_550 [32];
  string local_530;
  string local_510 [32];
  string local_4f0;
  string local_4d0 [32];
  string local_4b0;
  string local_490 [32];
  string local_470;
  string local_450;
  option_group_definition new_options;
  wclass default_wclass;
  undefined1 local_350 [112];
  bool local_2e0;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  location = (float *)operator_new(0x70);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  location[3] = 0.0;
  location[4] = 0.0;
  location[5] = 0.0;
  location[6] = 0.0;
  location[7] = 0.0;
  location[8] = 0.0;
  location[9] = 0.0;
  location[10] = 0.0;
  location[0xb] = 0.0;
  location[0xc] = 0.0;
  location[0xd] = 0.0;
  location[0xe] = 0.0;
  location[0xf] = 0.0;
  location[0x10] = 0.0;
  location[0x11] = 0.0;
  location[0x12] = 0.0;
  location[0x13] = 0.0;
  location[0x14] = 0.0;
  location[0x15] = 0.0;
  location[0x16] = 0.0;
  location[0x17] = 0.0;
  location[0x18] = 0.0;
  location[0x19] = 0.0;
  location[0x1a] = 0.0;
  location[0x1b] = 0.0;
  sch->task_data = location;
  std::__cxx11::string::string
            ((string *)&local_450,"Entity Relation Options",(allocator *)&default_wclass);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string((string *)&local_470,"relation_cost",&local_5d1);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&default_wclass,&local_470,location + 2);
  ptVar1 = VW::config::typed_option<float>::default_value
                     ((typed_option<float> *)&default_wclass,1.0);
  std::__cxx11::string::string(local_490,"Relation Cost",&local_5d2);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (&new_options,ptVar1);
  std::__cxx11::string::string((string *)&local_4b0,"entity_cost",&local_5d3);
  VW::config::typed_option<float>::typed_option(&local_d0,&local_4b0,location + 1);
  local_d0.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  std::__cxx11::string::string(local_4d0,"Entity Cost",&local_5d4);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  std::__cxx11::string::string((string *)&local_4f0,"constraints",&local_5d5);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_4f0,(bool *)(location + 4));
  local_2e0 = true;
  std::__cxx11::string::string(local_510,"Use Constraints",&local_5d6);
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar2,(typed_option<bool> *)local_350);
  std::__cxx11::string::string((string *)&local_530,"relation_none_cost",&local_5d7);
  VW::config::typed_option<float>::typed_option(&local_170,&local_530,location);
  local_170.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_170,0.5);
  std::__cxx11::string::string(local_550,"None Relation Cost",&local_5d8);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  std::__cxx11::string::string((string *)&local_570,"skip_cost",&local_5d9);
  VW::config::typed_option<float>::typed_option(&local_210,&local_570,location + 3);
  local_210.super_base_option.m_keep = true;
  ptVar1 = VW::config::typed_option<float>::default_value(&local_210,0.01);
  std::__cxx11::string::string(local_590,"Skip Cost (only used when search_order = skip",&local_5da)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  poVar2 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar2,ptVar1)
  ;
  std::__cxx11::string::string((string *)&local_5b0,"search_order",&local_5db);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,&local_5b0,(unsigned_long *)(location + 0x16));
  local_2b0.super_base_option.m_keep = true;
  op = VW::config::typed_option<unsigned_long>::default_value(&local_2b0,0);
  std::__cxx11::string::string
            (local_5d0,"Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)",&local_5dc);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(poVar2,op);
  std::__cxx11::string::~string(local_5d0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_2b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string(local_590);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string(local_550);
  VW::config::typed_option<float>::~typed_option(&local_170);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string(local_510);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_350);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string(local_4d0);
  VW::config::typed_option<float>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string(local_490);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&default_wclass);
  std::__cxx11::string::~string((string *)&local_470);
  (**options->_vptr_options_i)(options);
  for (fVar4 = 1.4013e-45; fVar4 != 7.00649e-45; fVar4 = (float)((int)fVar4 + 1)) {
    default_wclass.x = fVar4;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)(location + 6),(uint *)&default_wclass);
  }
  for (fVar4 = 7.00649e-45; fVar4 != 1.54143e-44; fVar4 = (float)((int)fVar4 + 1)) {
    default_wclass.x = fVar4;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)(location + 0xe),(uint *)&default_wclass);
  }
  *(undefined1 *)((long)location + 0x11) = 0;
  if (*(long *)(location + 0x16) - 3U < 2) {
    peVar3 = VW::alloc_examples(0x20,10);
    default_wclass.x = 0.0;
    default_wclass.class_index = 0;
    default_wclass.partial_prediction = 0.0;
    default_wclass.wap_value = 0.0;
    for (lVar5 = 0x6828; lVar5 != 0x48048; lVar5 = lVar5 + 0x68d0) {
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 ((long)(peVar3->super_example_predict).feature_space + lVar5 + -0x20),
                 &default_wclass);
    }
    *(example **)(location + 0x18) = peVar3;
    *(example **)(location + 0x1a) = peVar3 + 4;
    Search::search::set_options(sch,Search::IS_LDF);
  }
  else {
    Search::search::set_options(sch,0);
  }
  Search::search::set_num_learners(sch,2);
  if (*(unsigned_long *)(location + 0x16) == 4) {
    Search::search::set_num_learners(sch,3);
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* my_task_data = new task_data();
  sch.set_task_data<task_data>(my_task_data);

  option_group_definition new_options("Entity Relation Options");
  new_options
      .add(make_option("relation_cost", my_task_data->relation_cost).keep().default_value(1.f).help("Relation Cost"))
      .add(make_option("entity_cost", my_task_data->entity_cost).keep().default_value(1.f).help("Entity Cost"))
      .add(make_option("constraints", my_task_data->constraints).keep().help("Use Constraints"))
      .add(make_option("relation_none_cost", my_task_data->relation_none_cost)
               .keep()
               .default_value(0.5f)
               .help("None Relation Cost"))
      .add(make_option("skip_cost", my_task_data->skip_cost)
               .keep()
               .default_value(0.01f)
               .help("Skip Cost (only used when search_order = skip"))
      .add(make_option("search_order", my_task_data->search_order)
               .keep()
               .default_value(0)
               .help("Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)"));
  options.add_and_parse(new_options);

  // setup entity and relation labels
  // Entity label 1:E_Other 2:E_Peop 3:E_Org 4:E_Loc
  // Relation label 5:R_Live_in 6:R_OrgBased_in 7:R_Located_in 8:R_Work_For 9:R_Kill 10:R_None
  for (int i = 1; i < 5; i++) my_task_data->y_allowed_entity.push_back(i);

  for (int i = 5; i < 11; i++) my_task_data->y_allowed_relation.push_back(i);

  my_task_data->allow_skip = false;

  if (my_task_data->search_order != 3 && my_task_data->search_order != 4)
  {
    sch.set_options(0);
  }
  else
  {
    example* ldf_examples = VW::alloc_examples(sizeof(CS::label), 10);
    CS::wclass default_wclass = {0., 0, 0., 0.};
    for (size_t a = 0; a < 10; a++)
    {
      ldf_examples[a].l.cs.costs.push_back(default_wclass);
    }
    my_task_data->ldf_entity = ldf_examples;
    my_task_data->ldf_relation = ldf_examples + 4;
    sch.set_options(Search::IS_LDF);
  }

  sch.set_num_learners(2);
  if (my_task_data->search_order == 4)
    sch.set_num_learners(3);
}